

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

void __thiscall
absl::lts_20250127::Cord::InlineRep::PrependTree
          (InlineRep *this,Nonnull<CordRep_*> tree,MethodIdentifier method)

{
  if (tree == (Nonnull<CordRep_*>)0x0) {
    __assert_fail("tree != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                  ,0x100,
                  "void absl::Cord::InlineRep::PrependTree(absl::Nonnull<CordRep *>, MethodIdentifier)"
                 );
  }
  if (tree->length == 0) {
    __assert_fail("tree->length != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                  ,0x101,
                  "void absl::Cord::InlineRep::PrependTree(absl::Nonnull<CordRep *>, MethodIdentifier)"
                 );
  }
  if (tree->tag == '\x02') {
    __assert_fail("!tree->IsCrc()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                  ,0x102,
                  "void absl::Cord::InlineRep::PrependTree(absl::Nonnull<CordRep *>, MethodIdentifier)"
                 );
  }
  if (((this->data_).rep_.field_0.data[0] & 1U) == 0) {
    PrependTreeToInlined(this,tree,method);
    return;
  }
  PrependTreeToTree(this,tree,method);
  return;
}

Assistant:

void Cord::InlineRep::PrependTree(absl::Nonnull<CordRep*> tree,
                                  MethodIdentifier method) {
  assert(tree != nullptr);
  assert(tree->length != 0);
  assert(!tree->IsCrc());
  if (data_.is_tree()) {
    PrependTreeToTree(tree, method);
  } else {
    PrependTreeToInlined(tree, method);
  }
}